

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1ha0_ia32aes_a.h
# Opt level: O3

uint64_t t1ha0_ia32aes_noavx(void *data,size_t len,uint64_t seed)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [16];
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [16];
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [16];
  sbyte sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 *puVar14;
  undefined1 (*pauVar15) [16];
  undefined1 *puVar16;
  byte bVar17;
  uint uVar18;
  uint64_t a;
  ulong uVar19;
  size_t sVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  
  sVar20 = len;
  if (0x20 < len) {
    pauVar7 = (undefined1 (*) [16])((long)data + (len - 0x7f));
    auVar22._8_8_ = seed;
    auVar22._0_8_ = len;
    auVar26 = aesenc(auVar22,_DAT_001a4410);
    if (data < pauVar7) {
      do {
        auVar21 = *data;
        pauVar1 = (undefined1 (*) [16])((long)data + 0x70);
        pauVar15 = (undefined1 (*) [16])((long)data + 0x70);
        auVar31 = *(undefined1 (*) [16])((long)data + 0x60);
        pauVar2 = (undefined1 (*) [16])((long)data + 0x20);
        pauVar3 = (undefined1 (*) [16])((long)data + 0x10);
        pauVar4 = (undefined1 (*) [16])((long)data + 0x40);
        pauVar5 = (undefined1 (*) [16])((long)data + 0x50);
        pauVar6 = (undefined1 (*) [16])((long)data + 0x30);
        data = (void *)((long)data + 0x80);
        auVar27 = aesenc(auVar21,auVar26);
        auVar32._0_8_ = *(long *)*pauVar1 + auVar31._0_8_;
        auVar32._8_8_ = *(long *)(*pauVar15 + 8) + auVar31._8_8_;
        auVar21 = aesenc(*pauVar4,*pauVar5);
        auVar24._0_8_ = auVar22._0_8_ + auVar26._0_8_;
        auVar24._8_8_ = auVar22._8_8_ + auVar26._8_8_;
        auVar22 = aesenc(*pauVar2,auVar31 ^ auVar22);
        auVar31._0_8_ = *(long *)*pauVar1 - auVar27._0_8_;
        auVar31._8_8_ = *(long *)(*pauVar15 + 8) - auVar27._8_8_;
        auVar31 = aesdec(auVar31,*pauVar3);
        auVar26 = aesenc(auVar22,*pauVar6);
        auVar22 = aesenc(auVar21 ^ auVar32,auVar24);
        auVar26 = aesenc(auVar26,auVar31 ^ *pauVar5);
      } while (data < pauVar7);
    }
    if ((len & 0x40) != 0) {
      puVar14 = *(undefined1 (*) [16])data;
      puVar16 = *(undefined1 (*) [16])data;
      pauVar7 = (undefined1 (*) [16])((long)data + 0x10);
      pauVar3 = (undefined1 (*) [16])((long)data + 0x10);
      pauVar1 = (undefined1 (*) [16])((long)data + 0x20);
      pauVar4 = (undefined1 (*) [16])((long)data + 0x20);
      pauVar2 = (undefined1 (*) [16])((long)data + 0x30);
      pauVar5 = (undefined1 (*) [16])((long)data + 0x30);
      data = (void *)((long)data + 0x40);
      auVar21._0_8_ = *(long *)puVar14 + auVar26._0_8_;
      auVar21._8_8_ = *(long *)(puVar16 + 8) + auVar26._8_8_;
      auVar30._0_8_ = auVar22._0_8_ - *(long *)*pauVar7;
      auVar30._8_8_ = auVar22._8_8_ - *(long *)(*pauVar3 + 8);
      auVar22 = aesdec(auVar22,auVar21);
      auVar26 = aesdec(auVar26,auVar30);
      auVar28._0_8_ = *(long *)*pauVar1 + auVar26._0_8_;
      auVar28._8_8_ = *(long *)(*pauVar4 + 8) + auVar26._8_8_;
      auVar27._0_8_ = auVar22._0_8_ - *(long *)*pauVar2;
      auVar27._8_8_ = auVar22._8_8_ - *(long *)(*pauVar5 + 8);
      auVar22 = aesdec(auVar22,auVar28);
      auVar26 = aesdec(auVar26,auVar27);
    }
    if ((len & 0x20) != 0) {
      puVar14 = *(undefined1 (*) [16])data;
      puVar16 = *(undefined1 (*) [16])data;
      pauVar7 = (undefined1 (*) [16])((long)data + 0x10);
      pauVar1 = (undefined1 (*) [16])((long)data + 0x10);
      data = (void *)((long)data + 0x20);
      auVar25._0_8_ = *(long *)puVar14 + auVar26._0_8_;
      auVar25._8_8_ = *(long *)(puVar16 + 8) + auVar26._8_8_;
      auVar29._0_8_ = auVar22._0_8_ - *(long *)*pauVar7;
      auVar29._8_8_ = auVar22._8_8_ - *(long *)(*pauVar1 + 8);
      auVar22 = aesdec(auVar22,auVar25);
      auVar26 = aesdec(auVar26,auVar29);
    }
    if ((len & 0x10) != 0) {
      auVar21 = *data;
      lVar23 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + auVar22._0_8_;
      auVar26._8_8_ = lVar23 + auVar22._8_8_;
      data = (void *)((long)data + 0x10);
      auVar22 = aesdec(auVar22,auVar21);
    }
    auVar21 = aesenc(auVar26,auVar22);
    len = (size_t)((uint)len & 0xf);
    auVar22 = aesdec(auVar22,auVar21);
    seed = auVar22._0_8_ + auVar26._0_8_;
    sVar20 = auVar22._8_8_ + auVar26._8_8_;
  }
  switch(len) {
  default:
    puVar14 = *(undefined1 (*) [16])data;
    data = *(undefined1 (*) [16])data + 8;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = *(long *)puVar14 + sVar20;
    seed = seed ^ SUB168(auVar13 * ZEXT816(0x9c06faf4d023e3ab),0);
    sVar20 = sVar20 + SUB168(auVar13 * ZEXT816(0x9c06faf4d023e3ab),8);
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    puVar14 = *(undefined1 (*) [16])data;
    data = *(undefined1 (*) [16])data + 8;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = *(long *)puVar14 + seed;
    sVar20 = sVar20 ^ SUB168(auVar9 * ZEXT816(0xbd9cacc22c6e9571),0);
    seed = seed + SUB168(auVar9 * ZEXT816(0xbd9cacc22c6e9571),8);
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
    puVar14 = *(undefined1 (*) [16])data;
    data = *(undefined1 (*) [16])data + 8;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = *(long *)puVar14 + sVar20;
    seed = seed ^ SUB168(auVar10 * ZEXT816(0xd4f06db99d67be4b),0);
    sVar20 = sVar20 + SUB168(auVar10 * ZEXT816(0xd4f06db99d67be4b),8);
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
    uVar18 = -(int)len & 7;
    if (((ulong)data & 0xff8) == 0) {
      bVar17 = (char)uVar18 * -8 + 0x40;
      sVar8 = (bVar17 < 0x41) * ('@' - bVar17);
      uVar19 = (ulong)(*(long *)*(undefined1 (*) [16])data << sVar8) >> sVar8;
    }
    else {
      uVar19 = *(ulong *)((long)data - (ulong)uVar18) >> (ulong)(uVar18 * 8);
    }
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uVar19 + seed;
    sVar20 = sVar20 ^ SUB168(auVar11 * ZEXT816(0x82434fe90edcef39),0);
    seed = seed + SUB168(auVar11 * ZEXT816(0x82434fe90edcef39),8);
  case 0:
    auVar12._8_8_ = 0;
    auVar12._0_8_ =
         ((seed >> 0x17 | seed << 0x29) + sVar20) * -0x34a50ac51c5553cf ^
         ((sVar20 >> 0x29 | sVar20 << 0x17) + seed) * -0x136640f27c8d3555;
    return SUB168(auVar12 * ZEXT816(0xc060724a8424f345),8) ^
           SUB168(auVar12 * ZEXT816(0xc060724a8424f345),0);
  }
}

Assistant:

uint64_t T1HA_IA32AES_NAME(const void *data, size_t len, uint64_t seed) {
  uint64_t a = seed;
  uint64_t b = len;

  if (unlikely(len > 32)) {
    __m128i x = _mm_set_epi64x(a, b);
    __m128i y = _mm_aesenc_si128(x, _mm_set_epi64x(prime_5, prime_6));

    const __m128i *__restrict v = (const __m128i *)data;
    const __m128i *__restrict const detent =
        (const __m128i *)((const uint8_t *)data + len - 127);

    while (v < detent) {
      __m128i v0 = _mm_loadu_si128(v + 0);
      __m128i v1 = _mm_loadu_si128(v + 1);
      __m128i v2 = _mm_loadu_si128(v + 2);
      __m128i v3 = _mm_loadu_si128(v + 3);
      __m128i v4 = _mm_loadu_si128(v + 4);
      __m128i v5 = _mm_loadu_si128(v + 5);
      __m128i v6 = _mm_loadu_si128(v + 6);
      __m128i v7 = _mm_loadu_si128(v + 7);

      __m128i v0y = _mm_aesenc_si128(v0, y);
      __m128i v2x6 = _mm_aesenc_si128(v2, _mm_xor_si128(x, v6));
      __m128i v45_67 =
          _mm_xor_si128(_mm_aesenc_si128(v4, v5), _mm_add_epi64(v6, v7));

      __m128i v0y7_1 = _mm_aesdec_si128(_mm_sub_epi64(v7, v0y), v1);
      __m128i v2x6_3 = _mm_aesenc_si128(v2x6, v3);

      x = _mm_aesenc_si128(v45_67, _mm_add_epi64(x, y));
      y = _mm_aesenc_si128(v2x6_3, _mm_xor_si128(v0y7_1, v5));
      v += 8;
    }

    if (len & 64) {
      __m128i v0y = _mm_add_epi64(y, _mm_loadu_si128(v++));
      __m128i v1x = _mm_sub_epi64(x, _mm_loadu_si128(v++));
      x = _mm_aesdec_si128(x, v0y);
      y = _mm_aesdec_si128(y, v1x);

      __m128i v2y = _mm_add_epi64(y, _mm_loadu_si128(v++));
      __m128i v3x = _mm_sub_epi64(x, _mm_loadu_si128(v++));
      x = _mm_aesdec_si128(x, v2y);
      y = _mm_aesdec_si128(y, v3x);
    }

    if (len & 32) {
      __m128i v0y = _mm_add_epi64(y, _mm_loadu_si128(v++));
      __m128i v1x = _mm_sub_epi64(x, _mm_loadu_si128(v++));
      x = _mm_aesdec_si128(x, v0y);
      y = _mm_aesdec_si128(y, v1x);
    }

    if (len & 16) {
      y = _mm_add_epi64(x, y);
      x = _mm_aesdec_si128(x, _mm_loadu_si128(v++));
    }

    x = _mm_add_epi64(_mm_aesdec_si128(x, _mm_aesenc_si128(y, x)), y);
#if defined(__x86_64__) || defined(_M_X64)
#if defined(__SSE4_1__) || defined(__AVX__)
    a = _mm_extract_epi64(x, 0);
    b = _mm_extract_epi64(x, 1);
#else
    a = _mm_cvtsi128_si64(x);
    b = _mm_cvtsi128_si64(_mm_unpackhi_epi64(x, x));
#endif
#else
#if defined(__SSE4_1__) || defined(__AVX__)
    a = (uint32_t)_mm_extract_epi32(x, 0) | (uint64_t)_mm_extract_epi32(x, 1)
                                                << 32;
    b = (uint32_t)_mm_extract_epi32(x, 2) | (uint64_t)_mm_extract_epi32(x, 3)
                                                << 32;
#else
    a = (uint32_t)_mm_cvtsi128_si32(x);
    a |= (uint64_t)_mm_cvtsi128_si32(_mm_shuffle_epi32(x, 1)) << 32;
    x = _mm_unpackhi_epi64(x, x);
    b = (uint32_t)_mm_cvtsi128_si32(x);
    b |= (uint64_t)_mm_cvtsi128_si32(_mm_shuffle_epi32(x, 1)) << 32;
#endif
#endif
#ifdef __AVX__
    _mm256_zeroall();
#elif !(defined(_X86_64_) || defined(__x86_64__) || defined(_M_X64))
    _mm_empty();
#endif
    data = v;
    len &= 15;
  }

  const uint64_t *v = (const uint64_t *)data;
  switch (len) {
  default:
    mixup64(&a, &b, fetch64_le_unaligned(v++), prime_4);
  /* fall through */
  case 24:
  case 23:
  case 22:
  case 21:
  case 20:
  case 19:
  case 18:
  case 17:
    mixup64(&b, &a, fetch64_le_unaligned(v++), prime_3);
  /* fall through */
  case 16:
  case 15:
  case 14:
  case 13:
  case 12:
  case 11:
  case 10:
  case 9:
    mixup64(&a, &b, fetch64_le_unaligned(v++), prime_2);
  /* fall through */
  case 8:
  case 7:
  case 6:
  case 5:
  case 4:
  case 3:
  case 2:
  case 1:
    mixup64(&b, &a, tail64_le_unaligned(v, len), prime_1);
  /* fall through */
  case 0:
    return final64(a, b);
  }
}